

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
* __thiscall
Board::get_endangered_pieces
          (map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
           *__return_storage_ptr__,Board *this,play *single_play)

{
  size_t this_00;
  bool bVar1;
  reference this_01;
  element_type *peVar2;
  Point *pPVar3;
  shared_ptr<Piece> *psVar4;
  mapped_type *pmVar5;
  pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_> *move;
  const_iterator __end1;
  const_iterator __begin1;
  play *__range1;
  map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  endangered_pieces;
  play *single_play_local;
  Board *this_local;
  
  endangered_pieces._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)single_play;
  std::
  map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  ::map((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
         *)&__range1);
  this_00 = endangered_pieces._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1 = std::
           vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>
           ::begin((vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>
                    *)endangered_pieces._M_t._M_impl.super__Rb_tree_header._M_node_count);
  move = (pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_> *)
         std::
         vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>
         ::end((vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>
                *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_*,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>
                                     *)&move), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<const_std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_*,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>
              ::operator*(&__end1);
    bVar1 = std::operator!=(&this_01->second,(nullptr_t)0x0);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this_01->second);
      pPVar3 = Piece::get_position(peVar2);
      psVar4 = TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,pPVar3);
      peVar2 = std::__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this_01->second);
      pPVar3 = Piece::get_position(peVar2);
      pmVar5 = std::
               map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
               ::operator[]((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                             *)&__range1,pPVar3);
      std::shared_ptr<Piece>::operator=(pmVar5,psVar4);
    }
    peVar2 = std::__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        this_01);
    pPVar3 = Piece::get_position(peVar2);
    psVar4 = TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,pPVar3);
    peVar2 = std::__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        this_01);
    pPVar3 = Piece::get_position(peVar2);
    pmVar5 = std::
             map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
             ::operator[]((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                           *)&__range1,pPVar3);
    std::shared_ptr<Piece>::operator=(pmVar5,psVar4);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_*,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  ::map(__return_storage_ptr__,
        (map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
         *)&__range1);
  std::
  map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  ::~map((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
          *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

map<Point, shared_ptr<Piece>> Board::get_endangered_pieces(const play &single_play) const {
    map<Point, shared_ptr<Piece>> endangered_pieces;
    for (const auto &move : single_play) {
        if (move.second != nullptr) {
            endangered_pieces[move.second->get_position()] = m_board[move.second->get_position()];
        }
        endangered_pieces[move.first->get_position()] = m_board[move.first->get_position()];
    }
    return move(endangered_pieces);
}